

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

void __thiscall cmUuid::cmUuid(cmUuid *this)

{
  value_type_conflict2 local_34 [8];
  value_type_conflict2 local_14;
  cmUuid *local_10;
  cmUuid *this_local;
  
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->Groups);
  local_14 = 4;
  std::vector<int,_std::allocator<int>_>::push_back(&this->Groups,&local_14);
  local_34[3] = 2;
  std::vector<int,_std::allocator<int>_>::push_back(&this->Groups,local_34 + 3);
  local_34[2] = 2;
  std::vector<int,_std::allocator<int>_>::push_back(&this->Groups,local_34 + 2);
  local_34[1] = 2;
  std::vector<int,_std::allocator<int>_>::push_back(&this->Groups,local_34 + 1);
  local_34[0] = 6;
  std::vector<int,_std::allocator<int>_>::push_back(&this->Groups,local_34);
  return;
}

Assistant:

cmUuid::cmUuid()
{
  Groups.push_back(4);
  Groups.push_back(2);
  Groups.push_back(2);
  Groups.push_back(2);
  Groups.push_back(6);
}